

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaD_reallocstack(lua_State *L,int newsize)

{
  StkId block;
  CallInfo *pCVar1;
  GCObject *pGVar2;
  StkId pTVar3;
  CallInfo *pCVar4;
  
  if (newsize < -7) {
    luaG_runerror(L,"memory allocation error: block too big");
  }
  block = L->stack;
  pTVar3 = (StkId)luaM_realloc_(L,block,(long)L->stacksize << 4,(long)newsize * 0x10 + 0x60);
  L->stack = pTVar3;
  L->stacksize = newsize + 6;
  L->stack_last = pTVar3 + newsize;
  L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar3);
  pGVar2 = L->openupval;
  while (pGVar2 != (GCObject *)0x0) {
    (pGVar2->h).metatable = (Table *)(((long)(pGVar2->h).metatable - (long)block) + (long)L->stack);
    pGVar2 = (pGVar2->gch).next;
  }
  pCVar1 = L->ci;
  pCVar4 = L->base_ci;
  if (pCVar4 <= pCVar1) {
    pTVar3 = L->stack;
    do {
      pCVar4->top = (StkId)(((long)pCVar4->top - (long)block) + (long)pTVar3);
      pCVar4->base = (StkId)(((long)pCVar4->base - (long)block) + (long)pTVar3);
      pCVar4->func = (StkId)(((long)pCVar4->func - (long)block) + (long)pTVar3);
      pCVar4 = pCVar4 + 1;
    } while (pCVar4 <= pCVar1);
  }
  L->base = (StkId)(((long)L->base - (long)block) + (long)L->stack);
  return;
}

Assistant:

static void luaD_reallocstack(lua_State*L,int newsize){
TValue*oldstack=L->stack;
int realsize=newsize+1+5;
luaM_reallocvector(L,L->stack,L->stacksize,realsize,TValue);
L->stacksize=realsize;
L->stack_last=L->stack+newsize;
correctstack(L,oldstack);
}